

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  short sVar1;
  uint uVar2;
  MemPage *pMVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  *pRes = 0;
  if (pCur->eState == '\x01') {
    sVar1 = pCur->iPage;
    pMVar3 = pCur->apPage[sVar1];
    uVar7 = pCur->aiIdx[sVar1] + 1;
    pCur->aiIdx[sVar1] = uVar7;
    if (pMVar3->nCell <= uVar7) {
      pCur->aiIdx[pCur->iPage] = pCur->aiIdx[pCur->iPage] - 1;
      iVar5 = btreeNext(pCur,pRes);
      return iVar5;
    }
    if (pMVar3->leaf != '\0') {
      return 0;
    }
    do {
      pMVar3 = pCur->apPage[pCur->iPage];
      if (pMVar3->leaf != '\0') {
        return 0;
      }
      uVar2 = *(uint *)(pMVar3->aData +
                       (CONCAT11(pMVar3->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                 pMVar3->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                       pMVar3->maskPage));
      iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                               uVar2 << 0x18);
    } while (iVar5 == 0);
    return iVar5;
  }
  bVar4 = pCur->eState;
  if (bVar4 != 1) {
    if (2 < bVar4) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar4 = pCur->eState;
    }
    if (bVar4 == 0) {
      *pRes = 1;
      return 0;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar5) {
        return 0;
      }
    }
  }
  sVar1 = pCur->iPage;
  pMVar3 = pCur->apPage[sVar1];
  uVar7 = pCur->aiIdx[sVar1] + 1;
  pCur->aiIdx[sVar1] = uVar7;
  if (uVar7 < pMVar3->nCell) {
    if (pMVar3->leaf == '\0') {
LAB_001363ef:
      iVar5 = moveToLeftmost(pCur);
      return iVar5;
    }
  }
  else {
    if (pMVar3->leaf == '\0') {
      uVar2 = *(uint *)(pMVar3->aData + (ulong)pMVar3->hdrOffset + 8);
      iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                               uVar2 << 0x18);
      if (iVar5 != 0) {
        return iVar5;
      }
      goto LAB_001363ef;
    }
    uVar6 = (ulong)(ushort)pCur->iPage;
    do {
      if ((short)uVar6 == 0) {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      moveToParent(pCur);
      uVar6 = (ulong)pCur->iPage;
    } while (pCur->apPage[uVar6]->nCell <= pCur->aiIdx[uVar6]);
    if (pCur->apPage[uVar6]->intKey != '\0') {
      iVar5 = sqlite3BtreeNext(pCur,pRes);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorHoldsMutex(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}